

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.hpp
# Opt level: O0

void __thiscall
webfront::websocket::WebSocket<webfront::networking::TCPNetworkingTS>::WebSocket
          (WebSocket<webfront::networking::TCPNetworkingTS> *this,Socket *netSocket)

{
  string_view fmt;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  basic_stream_socket<std::experimental::net::v1::ip::tcp> *in_stack_ffffffffffffff98;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>)> *in_stack_ffffffffffffffa0;
  function<void_(webfront::websocket::CloseEvent)> *this_00;
  basic_string_view<char,_std::char_traits<char>_> *l;
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  FrameDecoder *this_01;
  
  pbVar1 = in_RDI;
  http::std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>::
  basic_stream_socket((basic_stream_socket<std::experimental::net::v1::ip::tcp> *)
                      in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_01 = (FrameDecoder *)(pbVar1 + 0x202);
  FrameDecoder::FrameDecoder(this_01);
  http::std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>::function
            (in_stack_ffffffffffffffa0);
  this_00 = (function<void_(webfront::websocket::CloseEvent)> *)(in_RDI + 0x209);
  http::std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>::function
            ((function<void_(std::span<const_std::byte,_18446744073709551615UL>)> *)this_00);
  l = in_RDI + 0x20b;
  http::std::function<void_(webfront::websocket::CloseEvent)>::function(this_00);
  *(undefined1 *)&in_RDI[0x20d]._M_len = 0;
  http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)l);
  fmt._M_str = (char *)this_01;
  fmt._M_len = (size_t)pbVar1;
  log::debug<>::debug((debug<> *)in_RDI,fmt,(srcLoc *)l);
  start((WebSocket<webfront::networking::TCPNetworkingTS> *)0x13a8cc);
  return;
}

Assistant:

explicit WebSocket(typename Net::Socket netSocket) : socket(std::move(netSocket)), started(false) {
        log::debug("WebSocket constructor");
        start();
    }